

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O3

ssize_t hread2(hFILE *fp,void *destv,size_t nbytes,size_t nread)

{
  char *pcVar1;
  char *pcVar2;
  ssize_t sVar3;
  size_t sVar4;
  int *piVar5;
  ulong __n;
  ulong uVar6;
  void *__dest;
  
  pcVar1 = fp->limit;
  pcVar2 = fp->buffer;
  __dest = (void *)((long)destv + nread);
  uVar6 = nbytes - nread;
  while (((ulong)((long)pcVar1 - (long)pcVar2) <= uVar6 * 2 && ((fp->field_0x30 & 1) == 0))) {
    sVar3 = (*fp->backend->read)(fp,__dest,uVar6);
    if (sVar3 < 0) {
      piVar5 = __errno_location();
      fp->has_errno = *piVar5;
      return sVar3;
    }
    if (sVar3 == 0) {
      fp->field_0x30 = fp->field_0x30 | 1;
    }
    fp->offset = fp->offset + sVar3;
    __dest = (void *)((long)__dest + sVar3);
    uVar6 = uVar6 - sVar3;
    nread = nread + sVar3;
  }
  while (((sVar4 = nread, uVar6 != 0 && ((fp->field_0x30 & 1) == 0)) &&
         (sVar4 = refill_buffer(fp), -1 < (long)sVar4))) {
    __n = (long)fp->end - (long)fp->begin;
    if (uVar6 <= __n) {
      __n = uVar6;
    }
    memcpy(__dest,fp->begin,__n);
    fp->begin = fp->begin + __n;
    __dest = (void *)((long)__dest + __n);
    nread = nread + __n;
    uVar6 = uVar6 - __n;
  }
  return sVar4;
}

Assistant:

ssize_t hread2(hFILE *fp, void *destv, size_t nbytes, size_t nread)
{
    const size_t capacity = fp->limit - fp->buffer;
    char *dest = (char *) destv;
    dest += nread, nbytes -= nread;

    // Read large requests directly into the destination buffer
    while (nbytes * 2 >= capacity && !fp->at_eof) {
        ssize_t n = fp->backend->read(fp, dest, nbytes);
        if (n < 0) { fp->has_errno = errno; return n; }
        else if (n == 0) fp->at_eof = 1;
        fp->offset += n;
        dest += n, nbytes -= n;
        nread += n;
    }

    while (nbytes > 0 && !fp->at_eof) {
        size_t n;
        ssize_t ret = refill_buffer(fp);
        if (ret < 0) return ret;

        n = fp->end - fp->begin;
        if (n > nbytes) n = nbytes;
        memcpy(dest, fp->begin, n);
        fp->begin += n;
        dest += n, nbytes -= n;
        nread += n;
    }

    return nread;
}